

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::Block::
set_empty<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
          (Block *this,index_t i)

{
  undefined8 in_RSI;
  atomic<bool> *in_RDI;
  
  std::atomic<bool>::store(in_RDI,SUB81((ulong)in_RSI >> 0x38,0),(memory_order)in_RSI);
  return false;
}

Assistant:

inline bool set_empty(MOODYCAMEL_MAYBE_UNUSED index_t i) {
      MOODYCAMEL_CONSTEXPR_IF(context == explicit_context &&
                              QUEUE_BLOCK_SIZE <=
                                  EXPLICIT_BLOCK_EMPTY_COUNTER_THRESHOLD) {
        // Set flag
        assert(!emptyFlags[QUEUE_BLOCK_SIZE - 1 -
                           static_cast<size_t>(
                               i & static_cast<index_t>(QUEUE_BLOCK_SIZE - 1))]
                    .load(std::memory_order_relaxed));
        emptyFlags[QUEUE_BLOCK_SIZE - 1 -
                   static_cast<size_t>(
                       i & static_cast<index_t>(QUEUE_BLOCK_SIZE - 1))]
            .store(true, std::memory_order_release);
        return false;
      }
      else {
        // Increment counter
        auto prevVal =
            elementsCompletelyDequeued.fetch_add(1, std::memory_order_release);
        assert(prevVal < QUEUE_BLOCK_SIZE);
        return prevVal == QUEUE_BLOCK_SIZE - 1;
      }